

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_map.cpp
# Opt level: O1

void Omega_h::expand_into<long>
               (Read<signed_char> *a_data,LOs *a2b,Write<signed_char> *b_data,Int width)

{
  long *plVar1;
  Alloc **ppAVar2;
  ulong uVar3;
  Alloc *pAVar4;
  uint n;
  size_t sVar5;
  int iVar6;
  ScopedTimer omega_h_scoped_function_timer;
  type f;
  string __str;
  ScopedTimer local_d1;
  undefined1 local_d0 [24];
  Alloc *pAStack_b8;
  void *local_b0;
  Alloc *local_a8;
  void *local_a0;
  Alloc **local_98;
  long local_90;
  Alloc *local_88 [2];
  Alloc **local_78;
  long local_70;
  Alloc *local_68;
  long lStack_60;
  Write<signed_char> *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
             ,"");
  local_58 = b_data;
  plVar1 = (long *)std::__cxx11::string::append((char *)local_50);
  ppAVar2 = (Alloc **)(plVar1 + 2);
  if ((Alloc **)*plVar1 == ppAVar2) {
    local_68 = *ppAVar2;
    lStack_60 = plVar1[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *ppAVar2;
    local_78 = (Alloc **)*plVar1;
  }
  local_70 = plVar1[1];
  *plVar1 = (long)ppAVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,3,0x6a);
  pAVar4 = (Alloc *)0xf;
  if (local_78 != &local_68) {
    pAVar4 = local_68;
  }
  if (pAVar4 < (Alloc *)(local_90 + local_70)) {
    pAVar4 = (Alloc *)0xf;
    if (local_98 != local_88) {
      pAVar4 = local_88[0];
    }
    if ((Alloc *)(local_90 + local_70) <= pAVar4) {
      plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_78)
      ;
      goto LAB_0030859d;
    }
  }
  plVar1 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_98);
LAB_0030859d:
  local_d0._0_8_ = local_d0 + 0x10;
  pAVar4 = (Alloc *)(plVar1 + 2);
  if ((Alloc *)*plVar1 == pAVar4) {
    local_d0._16_8_ = pAVar4->size;
    pAStack_b8 = (Alloc *)plVar1[3];
  }
  else {
    local_d0._16_8_ = pAVar4->size;
    local_d0._0_8_ = (Alloc *)*plVar1;
  }
  local_d0._8_8_ = plVar1[1];
  *plVar1 = (long)pAVar4;
  plVar1[1] = 0;
  *(undefined1 *)&pAVar4->size = 0;
  begin_code("expand_into",(char *)local_d0._0_8_);
  if ((Alloc *)local_d0._0_8_ != (Alloc *)(local_d0 + 0x10)) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if (local_98 != local_88) {
    operator_delete(local_98,(ulong)((long)&local_88[0]->size + 1));
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,(ulong)((long)&local_68->size + 1));
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  pAVar4 = (a2b->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    sVar5 = pAVar4->size;
  }
  else {
    sVar5 = (ulong)pAVar4 >> 3;
  }
  n = (int)(sVar5 >> 2) - 1;
  pAVar4 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    uVar3 = pAVar4->size;
  }
  else {
    uVar3 = (ulong)pAVar4 >> 3;
  }
  iVar6 = n * width;
  if (iVar6 != (int)(uVar3 >> 3)) {
    if (((ulong)pAVar4 & 1) == 0) {
      uVar3 = pAVar4->size;
    }
    else {
      uVar3 = (ulong)pAVar4 >> 3;
    }
    printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n a_data.size= %d na= %d width= %d"
           ,uVar3 >> 3,(ulong)n,(ulong)(uint)width);
  }
  pAVar4 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)pAVar4 & 1) == 0) {
    uVar3 = pAVar4->size;
  }
  else {
    uVar3 = (ulong)pAVar4 >> 3;
  }
  if (iVar6 != (int)(uVar3 >> 3)) {
    if (((ulong)pAVar4 & 1) == 0) {
      uVar3 = pAVar4->size;
    }
    else {
      uVar3 = (ulong)pAVar4 >> 3;
    }
    printf("ERROR: a_data.size= %d na= %d width= %d\n",uVar3 >> 3,(ulong)n,(ulong)(uint)width);
  }
  local_a8 = (a_data->write_).shared_alloc_.alloc;
  if (((ulong)local_a8 & 1) == 0) {
    uVar3 = local_a8->size;
  }
  else {
    uVar3 = (ulong)local_a8 >> 3;
  }
  if (iVar6 == (int)(uVar3 >> 3)) {
    local_d0._0_8_ = (a2b->write_).shared_alloc_.alloc;
    if ((local_d0._0_8_ & 7) == 0 && (Alloc *)local_d0._0_8_ != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_d0._0_8_ = ((Alloc *)local_d0._0_8_)->size * 8 + 1;
      }
      else {
        ((Alloc *)local_d0._0_8_)->use_count = ((Alloc *)local_d0._0_8_)->use_count + 1;
      }
    }
    local_d0._8_8_ = (a2b->write_).shared_alloc_.direct_ptr;
    local_d0._16_4_ = width;
    pAStack_b8 = (local_58->shared_alloc_).alloc;
    if (((ulong)pAStack_b8 & 7) == 0 && pAStack_b8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        pAStack_b8 = (Alloc *)(pAStack_b8->size * 8 + 1);
      }
      else {
        pAStack_b8->use_count = pAStack_b8->use_count + 1;
      }
    }
    local_b0 = (local_58->shared_alloc_).direct_ptr;
    if (((ulong)local_a8 & 7) == 0 && local_a8 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_a8 = (Alloc *)(local_a8->size * 8 + 1);
      }
      else {
        local_a8->use_count = local_a8->use_count + 1;
      }
    }
    local_a0 = (a_data->write_).shared_alloc_.direct_ptr;
    parallel_for<Omega_h::expand_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::_lambda(int)_1_>
              (n,(type *)local_d0);
    expand_into<long>(Omega_h::Read<long>,Omega_h::Read<int>,Omega_h::Write<long>,int)::
    {lambda(int)#1}::~Write((_lambda_int__1_ *)local_d0);
    ScopedTimer::~ScopedTimer(&local_d1);
    return;
  }
  fail("assertion %s failed at %s +%d\n","a_data.size() == na * width",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_map.cpp"
       ,0x6e);
}

Assistant:

void expand_into(Read<T> a_data, LOs a2b, Write<T> b_data, Int width) {
  OMEGA_H_TIME_FUNCTION;
  auto na = a2b.size() - 1;
  if(a_data.size() != na * width) printf("This error can happen when an array has been subsetted - check sync_array usage vs sync_subset_array:\n"
                                         " a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  OMEGA_H_CHECK_PRINTF(a_data.size() == na * width, "a_data.size= %d na= %d width= %d", a_data.size(), na, width);
  auto f = OMEGA_H_LAMBDA(LO a) {
    for (auto b = a2b[a]; b < a2b[a + 1]; ++b) {
      for (Int j = 0; j < width; ++j) {
        b_data[b * width + j] = a_data[a * width + j];
      }
    }
  };
  parallel_for(na, std::move(f));
}